

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::insert
          (QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,int *key,
          pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *value)

{
  bool bVar1;
  QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
  *pQVar2;
  long in_FS_OFFSET;
  iterator i;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> copy;
  multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>
  *in_stack_ffffffffffffff78;
  iterator it;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_stack_ffffffffffffff80;
  pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this_00;
  const_iterator in_stack_ffffffffffffff98;
  pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> local_48;
  _Rb_tree_const_iterator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
  local_28;
  iterator local_20;
  undefined8 local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff80->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffff80,
              (QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
              in_stack_ffffffffffffff78);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2d7cc8);
  }
  detach(in_stack_ffffffffffffff80);
  local_20._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
                *)0x2d7ceb);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>
       ::lower_bound(in_stack_ffffffffffffff78,(key_type *)0x2d7cfc);
  pQVar2 = QtPrivate::
           QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
           ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
                         *)0x2d7d0b);
  it._M_node = (_Base_ptr)&pQVar2->m;
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
  ::_Rb_tree_const_iterator(&local_28,&local_20);
  this_00 = &local_48;
  std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::
  pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_true>
            (this_00,(int *)it._M_node,(pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x2d7d3b);
  std::
  multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>
  ::insert((multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>
            *)this_00,in_stack_ffffffffffffff98,(value_type *)it._M_node);
  iterator::iterator((iterator *)0x2d7d62,it);
  std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::~pair
            ((pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2d7d6c);
  ~QMultiMap((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2d7d76);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }